

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

void decode_session_filename(char *in,strbuf *out)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  int j;
  int i;
  strbuf *out_local;
  char *in_local;
  
  out_local = (strbuf *)in;
  while (*(char *)&out_local->s != '\0') {
    if (((*(char *)&out_local->s == '%') && (*(char *)((long)&out_local->s + 1) != '\0')) &&
       (*(char *)((long)&out_local->s + 2) != '\0')) {
      iVar2 = *(char *)((long)&out_local->s + 1) + -0x30;
      cVar4 = '\0';
      if (9 < iVar2) {
        cVar4 = '\a';
      }
      iVar3 = *(char *)((long)&out_local->s + 2) + -0x30;
      cVar1 = '\0';
      if (9 < iVar3) {
        cVar1 = '\a';
      }
      BinarySink_put_byte(out->binarysink_,((char)iVar2 - cVar4) * '\x10' + ((char)iVar3 - cVar1));
      out_local = (strbuf *)((long)&out_local->s + 3);
    }
    else {
      BinarySink_put_byte(out->binarysink_,*(uchar *)&out_local->s);
      out_local = (strbuf *)((long)&out_local->s + 1);
    }
  }
  return;
}

Assistant:

static void decode_session_filename(const char *in, strbuf *out)
{
    while (*in) {
        if (*in == '%' && in[1] && in[2]) {
            int i, j;

            i = in[1] - '0';
            i -= (i > 9 ? 7 : 0);
            j = in[2] - '0';
            j -= (j > 9 ? 7 : 0);

            put_byte(out, (i << 4) + j);
            in += 3;
        } else {
            put_byte(out, *in++);
        }
    }
}